

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject_p.h
# Opt level: O2

void QtPrivate::
     QPrivateSlotObject<void_(QHeaderViewPrivate::*)(const_QModelIndex_&,_int,_int),_QtPrivate::List<const_QModelIndex_&,_int,_int>,_void>
     ::impl(int which,QSlotObjectBase *this_,QObject *r,void **a,bool *ret)

{
  if (which == 2) {
    *ret = ((ImplFn)a[1] == this_[1].m_impl || *a == (void *)0x0) && *a == *(void **)(this_ + 1);
  }
  else {
    if (which == 1) {
      FunctorCall<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_QtPrivate::List<const_QModelIndex_&,_int,_int>,_void,_void_(QHeaderViewPrivate::*)(const_QModelIndex_&,_int,_int)>
      ::call(*(FunctorCall<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_QtPrivate::List<const_QModelIndex_&,_int,_int>,_void,_void_(QHeaderViewPrivate::*)(const_QModelIndex_&,_int,_int)>
               **)(this_ + 1),(Function)this_[1].m_impl,*(QHeaderViewPrivate **)(r + 8),a);
      return;
    }
    if (which == 0) {
      operator_delete(this_,0x20);
      return;
    }
  }
  return;
}

Assistant:

static void impl(QSlotObjectBase *this_, QObject *r, void **a, int which, bool *ret)
#endif
    {
        const auto that = static_cast<QPrivateSlotObject*>(this_);
        switch (which) {
            case Destroy:
                delete that;
                break;
            case Call:
                FuncType::template call<Args, R>(that->object(),
                                                 static_cast<typename FuncType::Object *>(QObjectPrivate::get(r)), a);
                break;
            case Compare:
                *ret = *reinterpret_cast<Func *>(a) == that->object();
                break;
            case NumOperations: ;
        }
    }